

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixByteChunk.h
# Opt level: O1

void __thiscall
DIS::LinearSegmentParameter::setSegmentAppearance(LinearSegmentParameter *this,SixByteChunk *pX)

{
  *(undefined2 *)((this->_segmentAppearance)._otherParameters + 4) =
       *(undefined2 *)(pX->_otherParameters + 4);
  *(undefined4 *)(this->_segmentAppearance)._otherParameters = *(undefined4 *)pX->_otherParameters;
  return;
}

Assistant:

class OPENDIS6_EXPORT SixByteChunk
{
protected:
  /** six bytes of arbitrary data */
  char _otherParameters[6]; 


 public:
    SixByteChunk();
    virtual ~SixByteChunk();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    char*  getOtherParameters(); 
    const char*  getOtherParameters() const; 
    void setOtherParameters( const char*    pX);


virtual int getMarshalledSize() const;

     bool operator  ==(const SixByteChunk& rhs) const;
}